

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec3 val)

{
  pointer pGVar1;
  size_t __n;
  undefined1 auVar2 [16];
  int iVar3;
  invalid_argument *piVar4;
  pointer pGVar5;
  undefined8 in_XMM0_Qb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*glad_glUseProgram)(this->programHandle);
  pGVar5 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar5 != pGVar1) {
    __n = name->_M_string_length;
    do {
      if ((pGVar5->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_002050b6:
          if (pGVar5->type == Vector3Float) {
            auVar2._8_8_ = in_XMM0_Qb;
            auVar2._0_8_ = val._0_8_;
            auVar2 = vmovshdup_avx(auVar2);
            (*glad_glUniform3f)(pGVar5->location,val.field_0.x,auVar2._0_4_,val.field_2.z);
            pGVar5->isSet = true;
            return;
          }
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar4,"Tried to set GLShaderUniform with wrong type");
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        iVar3 = bcmp((pGVar5->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) goto LAB_002050b6;
      }
      pGVar5 = pGVar5 + 1;
    } while (pGVar5 != pGVar1);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"Tried to set nonexistent uniform with name ",name);
  std::invalid_argument::invalid_argument(piVar4,(string *)&local_48);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec3 val) {
  glUseProgram(programHandle);

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Vector3Float) {
        glUniform3f(u.location, val.x, val.y, val.z);
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}